

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall
spdlog::logger::log_<std::__cxx11::string&,std::__cxx11::string&,int&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,int *args_2)

{
  __int_type_conflict _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t *psVar6;
  size_t sVar7;
  undefined1 *puVar8;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  memory_buf_t buf;
  undefined1 local_1c8 [24];
  time_point tStack_1b0;
  ulong local_1a8;
  size_t local_1a0;
  size_t sStack_198;
  undefined4 local_190;
  undefined4 uStack_18c;
  int iStack_188;
  undefined4 uStack_184;
  char *local_180;
  char *local_178;
  size_t local_170;
  pointer local_168;
  size_type sStack_160;
  buffer<char> local_158;
  char local_138 [264];
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if (((int)lvl < iVar2 & (_Var1 ^ 1U)) == 0) {
    local_158.ptr_ = local_138;
    local_158.size_ = 0;
    local_158._vptr_buffer = (_func_int **)&PTR_grow_0044b2f0;
    local_158.capacity_ = 0xfa;
    local_1c8._0_8_ = (args->_M_dataplus)._M_p;
    local_1c8._8_8_ = args->_M_string_length;
    local_1c8._16_8_ = (args_1->_M_dataplus)._M_p;
    tStack_1b0.__d.__r = (duration)args_1->_M_string_length;
    local_1a8 = (ulong)(uint)*args_2;
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_1c8;
    args_00.desc_ = 0x1dd;
    ::fmt::v9::detail::vformat_to<char>(&local_158,fmt,args_00,(locale_ref)0x0);
    sVar4 = local_158.size_;
    pcVar3 = local_158.ptr_;
    local_168 = (this->name_)._M_dataplus._M_p;
    sStack_160 = (this->name_)._M_string_length;
    tStack_1b0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_1c8._0_8_ = local_168;
    local_1c8._8_8_ = sStack_160;
    local_1c8._16_4_ = lvl;
    pcVar5 = (char *)__tls_get_addr(&PTR_004a2968);
    if (*pcVar5 == '\0') {
      sVar7 = syscall(0xba);
      psVar6 = (size_t *)__tls_get_addr(&PTR_004a2f10);
      *psVar6 = sVar7;
      puVar8 = (undefined1 *)__tls_get_addr(&PTR_004a2968);
      *puVar8 = 1;
    }
    else {
      psVar6 = (size_t *)__tls_get_addr(&PTR_004a2f10);
      sVar7 = *psVar6;
    }
    local_1a0 = 0;
    sStack_198 = 0;
    local_190 = loc.filename._0_4_;
    uStack_18c = loc.filename._4_4_;
    iStack_188 = loc.line;
    uStack_184 = loc._12_4_;
    local_180 = loc.funcname;
    local_178 = pcVar3;
    local_170 = sVar4;
    local_1a8 = sVar7;
    if (iVar2 <= (int)lvl) {
      (*this->_vptr_logger[3])(this,local_1c8);
    }
    if ((_Var1 & 1U) != 0) {
      details::backtracer::push_back(&this->tracer_,(log_msg *)local_1c8);
    }
    if (local_158.ptr_ != local_138) {
      operator_delete(local_158.ptr_,local_158.capacity_);
    }
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }